

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int nodeRelease(Rtree *pRtree,RtreeNode *pNode)

{
  int *piVar1;
  ulong uVar2;
  RtreeNode *pRVar3;
  RtreeNode **ppRVar4;
  int iVar5;
  int iVar6;
  RtreeNode **ppRVar7;
  
  iVar5 = 0;
  if (pNode != (RtreeNode *)0x0) {
    piVar1 = &pNode->nRef;
    *piVar1 = *piVar1 + -1;
    iVar5 = 0;
    if (*piVar1 == 0) {
      pRtree->nNodeRef = pRtree->nNodeRef - 1;
      if (pNode->iNode == 1) {
        pRtree->iDepth = -1;
      }
      if (pNode->pParent == (RtreeNode *)0x0) {
        iVar5 = 0;
      }
      else {
        iVar5 = nodeRelease(pRtree,pNode->pParent);
      }
      if (iVar5 == 0) {
        iVar5 = nodeWrite(pRtree,pNode);
      }
      uVar2 = pNode->iNode;
      if (uVar2 != 0) {
        iVar6 = (int)((uVar2 & 0xffffffff) * 0x51d07eaf >> 0x20);
        ppRVar4 = pRtree->aHash +
                  ((int)uVar2 + (((uint)((int)uVar2 - iVar6) >> 1) + iVar6 >> 6) * -0x61);
        do {
          ppRVar7 = ppRVar4;
          pRVar3 = *ppRVar7;
          ppRVar4 = &pRVar3->pNext;
        } while (pRVar3 != pNode);
        *ppRVar7 = pNode->pNext;
        pNode->pNext = (RtreeNode *)0x0;
      }
      sqlite3_free(pNode);
    }
  }
  return iVar5;
}

Assistant:

static int nodeRelease(Rtree *pRtree, RtreeNode *pNode){
  int rc = SQLITE_OK;
  if( pNode ){
    assert( pNode->nRef>0 );
    assert( pRtree->nNodeRef>0 );
    pNode->nRef--;
    if( pNode->nRef==0 ){
      pRtree->nNodeRef--;
      if( pNode->iNode==1 ){
        pRtree->iDepth = -1;
      }
      if( pNode->pParent ){
        rc = nodeRelease(pRtree, pNode->pParent);
      }
      if( rc==SQLITE_OK ){
        rc = nodeWrite(pRtree, pNode);
      }
      nodeHashDelete(pRtree, pNode);
      sqlite3_free(pNode);
    }
  }
  return rc;
}